

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::Dynamic_Proxy_Function::build_param_type_list
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,Param_Types *t_types)

{
  pointer ppVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *t;
  pointer ppVar2;
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_49;
  Type_Info local_48;
  
  local_48._16_8_ = 0;
  local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_49);
  ppVar1 = (t_types->m_types).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (t_types->m_types).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    if (((ppVar2->second).m_flags & 0x20) == 0) {
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::push_back
                (__return_storage_ptr__,&ppVar2->second);
    }
    else {
      local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
      local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
      local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
      std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
      emplace_back<chaiscript::Type_Info>(__return_storage_ptr__,&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_param_type_list(const Param_Types &t_types) {
        // For the return type
        std::vector<Type_Info> types{chaiscript::detail::Get_Type_Info<Boxed_Value>::get()};

        for (const auto &t : t_types.types()) {
          if (t.second.is_undef()) {
            types.push_back(chaiscript::detail::Get_Type_Info<Boxed_Value>::get());
          } else {
            types.push_back(t.second);
          }
        }

        return types;
      }